

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O2

void integer_suite::test_literal_zero_one(void)

{
  undefined4 local_1e0;
  int local_1dc;
  size_type local_1d8 [4];
  writer writer;
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
  trial::protocol::json::basic_writer<char,16ul>::basic_writer<std::__cxx11::ostringstream>
            ((basic_writer<char,16ul> *)&writer,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&result);
  local_1dc = 0;
  local_1d8[0] = trial::protocol::json::basic_writer<char,_16UL>::value<int>(&writer,&local_1dc);
  local_1e0 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(0)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x7c,"void integer_suite::test_literal_zero_one()",local_1d8,&local_1e0);
  local_1dc = 1;
  local_1d8[0] = trial::protocol::json::basic_writer<char,_16UL>::value<int>(&writer,&local_1dc);
  local_1e0 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(1)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x7d,"void integer_suite::test_literal_zero_one()",local_1d8,&local_1e0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.str()","\"0,1\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x7e,"void integer_suite::test_literal_zero_one()",local_1d8,"0,1");
  std::__cxx11::string::~string((string *)local_1d8);
  trial::protocol::json::basic_writer<char,_16UL>::~basic_writer(&writer);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
  return;
}

Assistant:

void test_literal_zero_one()
{
    std::ostringstream result;
    json::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(0), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(1), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "0,1");
}